

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<SubArray,Macro>::emplace<Macro_const&>(QHash<SubArray,Macro> *this,SubArray *key,Macro *args)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *pDVar4;
  long in_FS_OFFSET;
  piter pVar5;
  Macro local_68;
  long local_30;
  
  uVar3 = local_68._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *(Data<QHashPrivate::Node<SubArray,_Macro>_> **)this;
  if (pDVar4 == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
    local_68._0_8_ = (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0;
LAB_0011f6a1:
    pDVar4 = (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0;
LAB_0011f6c2:
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::detached(pDVar4);
    *(Data<QHashPrivate::Node<SubArray,_Macro>_> **)this = pDVar4;
LAB_0011f6ca:
    pVar5 = (piter)emplace_helper<Macro_const&>(this,key,args);
    QHash<SubArray,_Macro>::~QHash((QHash<SubArray,_Macro> *)&local_68);
  }
  else {
    if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_68._0_8_ = pDVar4;
      if ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar4 = *(Data<QHashPrivate::Node<SubArray,_Macro>_> **)this;
        if (pDVar4 == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) goto LAB_0011f6a1;
      }
      if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0011f6c2;
      goto LAB_0011f6ca;
    }
    if (pDVar4->size < pDVar4->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        pVar5 = (piter)emplace_helper<Macro_const&>(this,key,args);
        return (iterator)pVar5;
      }
      goto LAB_0011f78c;
    }
    uVar1 = args->isFunction;
    uVar2 = args->isVariadic;
    local_68.isVariadic = (bool)uVar2;
    local_68.isFunction = (bool)uVar1;
    local_68._2_6_ = SUB86(uVar3,2);
    local_68.arguments.d.d = (args->arguments).d.d;
    local_68.arguments.d.ptr = (args->arguments).d.ptr;
    local_68.arguments.d.size = (args->arguments).d.size;
    if (local_68.arguments.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_68.symbols.d.d = (args->symbols).d.d;
    local_68.symbols.d.ptr = (args->symbols).d.ptr;
    local_68.symbols.d.size = (args->symbols).d.size;
    if (local_68.symbols.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    pVar5 = (piter)QHash<SubArray,_Macro>::emplace_helper<Macro>
                             ((QHash<SubArray,_Macro> *)this,key,&local_68);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_68.symbols.d);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_68.arguments.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar5;
  }
LAB_0011f78c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }